

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * strAccumFinishRealloc(StrAccum *p)

{
  char *__dest;
  ulong n;
  
  n = (ulong)(p->nChar + 1);
  if (p->db == (sqlite3 *)0x0) {
    __dest = (char *)sqlite3Malloc(n);
  }
  else {
    __dest = (char *)sqlite3DbMallocRawNN(p->db,n);
  }
  p->zText = __dest;
  if (__dest == (char *)0x0) {
    p->accError = '\x01';
    p->nAlloc = 0;
  }
  else {
    memcpy(__dest,p->zBase,(ulong)(p->nChar + 1));
    p->printfFlags = p->printfFlags | 4;
  }
  return p->zText;
}

Assistant:

static SQLITE_NOINLINE char *strAccumFinishRealloc(StrAccum *p){
  assert( p->mxAlloc>0 && !isMalloced(p) );
  p->zText = sqlite3DbMallocRaw(p->db, p->nChar+1 );
  if( p->zText ){
    memcpy(p->zText, p->zBase, p->nChar+1);
    p->printfFlags |= SQLITE_PRINTF_MALLOCED;
  }else{
    setStrAccumError(p, STRACCUM_NOMEM);
  }
  return p->zText;
}